

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  size_t _elemsize;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  pointer pMVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  int iVar16;
  ulong uVar17;
  void *__dest;
  int iVar18;
  long local_98;
  int local_90;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  pvVar5 = (this->slices).data;
  if (uVar7 == 1) {
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar8 != 0) {
      iVar2 = pMVar4->w;
      uVar9 = lVar8 >> 6;
      lVar8 = 0;
      lVar14 = 0;
      iVar11 = 0;
      uVar17 = 0;
      do {
        iVar16 = *(int *)((long)pvVar5 + uVar17 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar2 - (long)iVar11) / (uVar9 + lVar14));
        }
        Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar16,_elemsize,opt->blob_allocator);
        pvVar15 = *(void **)((long)&pMVar10->data + lVar8);
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8) ==
            0) {
          return -100;
        }
        memcpy(pvVar15,(void *)(_elemsize * (long)iVar11 + (long)pMVar4->data),
               (long)iVar16 * _elemsize);
        iVar11 = iVar11 + iVar16;
        uVar17 = uVar17 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
        lVar14 = lVar14 + -1;
        lVar8 = lVar8 + 0x40;
      } while (uVar17 < uVar9);
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar7 ^ 2) == 0 && uVar3 == 0) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar11 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        lVar8 = 0;
        lVar14 = 0;
        iVar16 = 0;
        uVar17 = 0;
        do {
          iVar12 = *(int *)((long)pvVar5 + uVar17 * 4);
          if (iVar12 == -0xe9) {
            iVar12 = (int)((ulong)((long)iVar11 - (long)iVar16) / (uVar9 + lVar14));
          }
          Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar2,iVar12,_elemsize,
                      opt->blob_allocator);
          pvVar15 = *(void **)((long)&pMVar10->data + lVar8);
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8)
              == 0) {
            return -100;
          }
          memcpy(pvVar15,(void *)((long)pMVar4->w * (long)iVar16 * pMVar4->elemsize +
                                 (long)pMVar4->data),(long)(iVar12 * iVar2) * _elemsize);
          iVar16 = iVar16 + iVar12;
          uVar17 = uVar17 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
          lVar14 = lVar14 + -1;
          lVar8 = lVar8 + 0x40;
        } while (uVar17 < uVar9);
      }
    }
    else if ((uVar7 ^ 2) == 0 && (uVar3 ^ 1) == 0) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar11 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        iVar16 = 0;
        uVar17 = 0;
        do {
          iVar12 = *(int *)((long)pvVar5 + uVar17 * 4);
          if (iVar12 == -0xe9) {
            iVar12 = (int)((ulong)((long)iVar2 - (long)iVar16) / (uVar9 - uVar17));
          }
          pMVar1 = pMVar10 + uVar17;
          Mat::create(pMVar1,iVar12,iVar11,_elemsize,opt->blob_allocator);
          if (pMVar10[uVar17].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < iVar11) {
            iVar18 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * (long)iVar18 * pMVar1->elemsize + (long)pMVar1->data
                             ),
                     (void *)((long)pMVar4->data +
                             (long)iVar16 * _elemsize +
                             (long)pMVar4->w * (long)iVar18 * pMVar4->elemsize),
                     (long)iVar12 * _elemsize);
              iVar18 = iVar18 + 1;
            } while (iVar11 != iVar18);
          }
          iVar16 = iVar16 + iVar12;
          uVar17 = uVar17 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
        } while (uVar17 < uVar9);
        return 0;
      }
    }
    else {
      uVar7 = uVar7 ^ 3;
      if (uVar7 == 0 && uVar3 == 0) {
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar10;
        if (lVar8 != 0) {
          iVar2 = pMVar4->w;
          iVar11 = pMVar4->h;
          iVar16 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          lVar8 = 0;
          local_98 = 0;
          iVar12 = 0;
          uVar17 = 0;
          do {
            iVar18 = *(int *)((long)pvVar5 + uVar17 * 4);
            if (iVar18 == -0xe9) {
              iVar18 = (int)((ulong)((long)iVar16 - (long)iVar12) / (uVar9 + local_98));
            }
            Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar2,iVar11,iVar18,_elemsize,
                        opt->blob_allocator);
            pvVar15 = *(void **)((long)&pMVar10->data + lVar8);
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
            if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8)
                == 0) {
              return -100;
            }
            memcpy(pvVar15,(void *)(pMVar4->cstep * (long)iVar12 * pMVar4->elemsize +
                                   (long)pMVar4->data),
                   (long)(iVar18 * (int)pMVar4->cstep) * _elemsize);
            iVar12 = iVar12 + iVar18;
            uVar17 = uVar17 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
            local_98 = local_98 + -1;
            lVar8 = lVar8 + 0x40;
          } while (uVar17 < uVar9);
          return 0;
        }
      }
      else {
        if ((uVar3 ^ 1) != 0 || uVar7 != 0) {
          if (uVar7 != 0 || uVar3 != 2) {
            return 0;
          }
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10;
          if (lVar8 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->h;
          uVar3 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          uVar17 = 0;
          iVar11 = 0;
          do {
            iVar16 = *(int *)((long)pvVar5 + uVar17 * 4);
            if (iVar16 == -0xe9) {
              iVar16 = (int)((ulong)((long)iVar2 - (long)iVar11) / (uVar9 - uVar17));
            }
            pMVar1 = pMVar10 + uVar17;
            Mat::create(pMVar1,iVar16,uVar7,uVar3,_elemsize,opt->blob_allocator);
            if (pMVar10[uVar17].data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar1->c * pMVar1->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar3) {
              uVar9 = 0;
              do {
                if (0 < (int)uVar7) {
                  sVar6 = pMVar4->elemsize;
                  iVar12 = pMVar4->w;
                  __dest = (void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data);
                  pvVar15 = (void *)((long)pMVar4->data +
                                    sVar6 * pMVar4->cstep * uVar9 + (long)iVar11 * _elemsize);
                  uVar13 = (ulong)uVar7;
                  do {
                    memcpy(__dest,pvVar15,(long)iVar16 * _elemsize);
                    __dest = (void *)((long)__dest + (long)iVar16 * _elemsize);
                    pvVar15 = (void *)((long)pvVar15 + (long)iVar12 * sVar6);
                    uVar13 = uVar13 - 1;
                  } while (uVar13 != 0);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar3);
            }
            iVar11 = iVar11 + iVar16;
            uVar17 = uVar17 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
          } while (uVar17 < uVar9);
          return 0;
        }
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar10;
        if (lVar8 != 0) {
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->c;
          iVar11 = pMVar4->h;
          uVar9 = lVar8 >> 6;
          uVar17 = 0;
          local_90 = 0;
          do {
            iVar16 = *(int *)((long)pvVar5 + uVar17 * 4);
            if (iVar16 == -0xe9) {
              iVar16 = (int)((ulong)((long)iVar11 - (long)local_90) / (uVar9 - uVar17));
            }
            pMVar1 = pMVar10 + uVar17;
            Mat::create(pMVar1,iVar2,iVar16,uVar7,_elemsize,opt->blob_allocator);
            if (pMVar10[uVar17].data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar1->c * pMVar1->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar7) {
              uVar9 = 0;
              do {
                memcpy((void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                       (void *)((long)pMVar4->data +
                               (long)pMVar4->w * (long)local_90 * pMVar4->elemsize +
                               pMVar4->cstep * uVar9 * pMVar4->elemsize),
                       (long)(iVar16 * iVar2) * _elemsize);
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
            local_90 = local_90 + iVar16;
            uVar17 = uVar17 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 6;
          } while (uVar17 < uVar9);
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}